

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::deallocate_clause(Internal *this,Clause *c)

{
  bool bVar1;
  void *in_RSI;
  long in_RDI;
  char *p;
  
  bVar1 = Arena::contains((Arena *)(in_RDI + 0x1be0),in_RSI);
  if ((!bVar1) && (in_RSI != (void *)0x0)) {
    operator_delete__(in_RSI);
  }
  return;
}

Assistant:

void Internal::deallocate_clause (Clause *c) {
  char *p = (char *) c;
  if (arena.contains (p))
    return;
  LOG (c, "deallocate pointer %p", (void *) c);
  delete[] p;
}